

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,VariableNode *node)

{
  Value *pVVar1;
  _Head_base<0UL,_Value_*,_false> _Var2;
  undefined8 uVar3;
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> _Var4;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar5;
  TypeName returnType;
  shared_ptr<BlockNode> body;
  RuntimeFunctionAnalyser functionAnalyser;
  ArgumentsList args;
  RuntimeVariableAnalyser analyser;
  string name;
  Executor executor;
  _Head_base<0UL,_Value_*,_false> local_320;
  _Storage<TypeName,_true> local_314;
  undefined1 local_310 [28];
  ulong local_2f4;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  local_2e8;
  __shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2> local_2d0;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  local_2c0;
  RuntimeVariableAnalyser local_2a8;
  string local_270;
  Executor local_250;
  
  std::__cxx11::string::string((string *)&local_270,(string *)&node->name_);
  oVar5 = Context::lookup(&this->context_,&local_270,0);
  _Var4 = oVar5.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>._M_payload;
  if (((undefined1  [16])
       oVar5.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> & (undefined1  [16])0x1)
      == (undefined1  [16])0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_310 + 0x10),"Dereferencing invalid symbol ",&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_310 + 0x10),"!");
    reportError((string *)&local_250,(Node *)node);
  }
  RuntimeVariableAnalyser::RuntimeVariableAnalyser(&local_2a8);
  (**(code **)(*(long *)_Var4 + 0x10))(_Var4,&local_2a8);
  if (local_2a8.symbolValid_ == true) {
    Executor(&local_250,
             (Context *)
             local_2a8.context_.
             super__Optional_base<std::reference_wrapper<const_Context>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<const_Context>_>._M_payload);
    (*((local_2a8.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_Node)._vptr_Node[2])
              (local_2a8.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_250);
    (**(code **)(*(long *)local_250.value_._M_t.
                          super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
                          super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
                          super__Head_base<0UL,_Value_*,_false>._M_head_impl + 0x10))
              (local_310 + 0x10);
    uVar3 = local_310._16_8_;
    local_310._16_8_ = (Value *)0x0;
    pVVar1 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
             super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
             super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
    super__Head_base<0UL,_Value_*,_false>._M_head_impl = (Value *)uVar3;
    if (pVVar1 != (Value *)0x0) {
      (*pVVar1->_vptr_Value[1])();
      if ((Value *)local_310._16_8_ != (Value *)0x0) {
        (*(*(_func_int ***)local_310._16_8_)[1])();
      }
    }
    ~Executor(&local_250);
  }
  else {
    RuntimeFunctionAnalyser::RuntimeFunctionAnalyser((RuntimeFunctionAnalyser *)(local_310 + 0x10));
    (**(code **)(*(long *)_Var4 + 0x10))(_Var4,local_310 + 0x10);
    if ((local_2f4 >> 0x20 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    local_314._M_value = (TypeName)local_2f4;
    std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
    ::list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
            *)&local_2c0,&local_2e8);
    std::__shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2> *)local_310,&local_2d0);
    Context::clone((Context *)&local_250,(__fn *)&this->context_,__child_stack,in_ECX,in_R8);
    std::
    make_unique<Function,TypeName_const&,std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>const&,std::shared_ptr<BlockNode>const&,Context>
              ((TypeName *)&local_320,
               (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                *)&local_314,(shared_ptr<BlockNode> *)&local_2c0,(Context *)local_310);
    _Var2._M_head_impl = local_320._M_head_impl;
    local_320._M_head_impl = (Value *)0x0;
    pVVar1 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
             super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
             super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
    super__Head_base<0UL,_Value_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (pVVar1 != (Value *)0x0) {
      (*pVVar1->_vptr_Value[1])();
      if (local_320._M_head_impl != (Value *)0x0) {
        (*(local_320._M_head_impl)->_vptr_Value[1])();
      }
    }
    local_320._M_head_impl = (Value *)0x0;
    std::
    deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
    ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
              *)&local_250);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_310 + 8));
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
    ::_M_clear(&local_2c0);
    RuntimeFunctionAnalyser::~RuntimeFunctionAnalyser((RuntimeFunctionAnalyser *)(local_310 + 0x10))
    ;
  }
  RuntimeVariableAnalyser::~RuntimeVariableAnalyser(&local_2a8);
  std::__cxx11::string::~string((string *)&local_270);
  return;
}

Assistant:

void Executor::visit(const VariableNode& node)
{
  const auto name = node.getName();
  const auto symbol = context_.lookup(name);

  if(!symbol)
    reportError("Dereferencing invalid symbol " + name + "!", node);

  RuntimeVariableAnalyser analyser{};
  symbol.value().get().accept(analyser);

  if(analyser.isSymbolValid())
  {
    const auto& value = analyser.getValue();
    auto executor = Executor{analyser.getContext()};

    value->accept(executor);
    value_ = executor.getValue()->clone();
  }
  else
  {
    RuntimeFunctionAnalyser functionAnalyser{};
    symbol.value().get().accept(functionAnalyser);

    const auto returnType = functionAnalyser.getReturnType().value();
    const auto args = functionAnalyser.getArguments();
    const auto body = functionAnalyser.getBody();

    value_ = std::make_unique<Function>(returnType, args, body, context_.clone());
  }
}